

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauDsd.c
# Opt level: O2

int Dau_DsdFindVarNum(char *pDsd)

{
  int vMax;
  byte bVar1;
  uint uVar2;
  
  vMax = 0;
  for (; *pDsd != '\0'; pDsd = pDsd + 1) {
    bVar1 = *pDsd + 0x9f;
    uVar2 = (uint)bVar1;
    if ((uint)bVar1 < (uint)vMax) {
      uVar2 = vMax;
    }
    if (bVar1 < 0x1a) {
      vMax = uVar2;
    }
  }
  return vMax + 1;
}

Assistant:

int Dau_DsdFindVarNum( char * pDsd )
{
    int vMax = 0;
    pDsd--;
    while ( *++pDsd )
        if ( *pDsd >= 'a' && *pDsd <= 'z' )
            vMax = Abc_MaxInt( vMax, *pDsd - 'a' );
    return vMax + 1;
}